

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  ushort in_CX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  bitset_container_t *in_RDI;
  bitset_container_t *bitset;
  array_container_t *array;
  int size;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  array_container_t *local_8;
  
  if (in_CX == 0) {
    local_8 = (array_container_t *)0x0;
  }
  else if (in_CX == 1) {
    local_8 = (array_container_t *)
              container_range_of_ones
                        ((uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffffd8,(uint8_t *)in_stack_ffffffffffffffd0);
  }
  else if ((int)((((in_EDX - in_ESI) + (uint)in_CX) - 1) / (uint)in_CX) < 0x1001) {
    *(undefined1 *)&in_RDI->cardinality = 2;
    local_8 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
    array_container_add_from_range
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
  }
  else {
    *(undefined1 *)&in_RDI->cardinality = 1;
    local_8 = (array_container_t *)bitset_container_create();
    bitset_container_add_from_range(in_RDI,in_ESI,in_EDX,in_CX);
  }
  return local_8;
}

Assistant:

static inline container_t *container_from_range(uint8_t *type, uint32_t min,
                                                uint32_t max, uint16_t step) {
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min, max, type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        // return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}